

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O1

void __thiscall
HttpdBufferedReader_StringTooLong_Test::~HttpdBufferedReader_StringTooLong_Test
          (HttpdBufferedReader_StringTooLong_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, StringTooLong) {
    using pstore::http::max_string_length;

    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _))
        .WillOnce (Invoke (yield_string (std::string (max_string_length + 1U, 'a'))));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function (), max_string_length + 1U);
    error_or_n<int, maybe<std::string>> const s2 = br.gets (io);
    EXPECT_EQ (s2.get_error (), make_error_code (pstore::http::error_code::string_too_long));
}